

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

int __thiscall sqlite::Connection::Stmt::bind_parameter_index(Stmt *this,string *name)

{
  int iVar1;
  Logic_error *this_00;
  char *pcVar2;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = sqlite3_bind_parameter_index(this->stmt_,(name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    return iVar1;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_80,"Error looking up index for bind var ",name);
  std::operator+(&local_60,&local_80,": ");
  pcVar2 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,pcVar2);
  pcVar2 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a1);
  Logic_error::Logic_error(this_00,&local_40,&local_a0,1,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

int Connection::Stmt::bind_parameter_index(const std::string & name)
    {
        int index = sqlite3_bind_parameter_index(stmt_, name.c_str());
        if(!index)
        {
            throw Logic_error("Error looking up index for bind var " +
                name + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return index;
    }